

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void dccvap_writefn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *opaque,uint64_t value)

{
  uc_struct_conflict2 *uc;
  long lVar1;
  void *ptr;
  uintptr_t unaff_retaddr;
  ram_addr_t offset;
  ram_addr_t local_10;
  
  lVar1 = 4L << (*(byte *)((long)env[1].xregs + 0xd6) & 0xf);
  uc = env->uc;
  ptr = probe_access_aarch64
                  (env,-lVar1 & value,(int)lVar1,MMU_DATA_LOAD,
                   *(byte *)((long)&env->hflags + 3) & 0xf,unaff_retaddr);
  if (ptr != (void *)0x0) {
    memory_region_from_host_aarch64(uc,ptr,&local_10);
  }
  return;
}

Assistant:

static void dccvap_writefn(CPUARMState *env, const ARMCPRegInfo *opaque,
                          uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    struct uc_struct *uc = env->uc;
    /* CTR_EL0 System register -> DminLine, bits [19:16] */
    uint64_t dline_size = 4 << ((cpu->ctr >> 16) & 0xF);
    uint64_t vaddr_in = (uint64_t) value;
    uint64_t vaddr = vaddr_in & ~(dline_size - 1);
    void *haddr;
    int mem_idx = cpu_mmu_index(env, false);

    /* This won't be crossing page boundaries */
    haddr = probe_read(env, vaddr, dline_size, mem_idx, GETPC());
    if (haddr) {

        ram_addr_t offset;
        MemoryRegion *mr;

        /* RCU lock is already being held */
        mr = memory_region_from_host(uc, haddr, &offset);
        if (mr) {
            // memory_region_do_writeback(mr, offset, dline_size); FIXME
        }
    }
}